

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

size_t secp256k1_pippenger_max_points(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  sVar1 = secp256k1_scratch_max_allocation(error_callback,scratch,6);
  lVar6 = 1;
  uVar5 = 2;
  uVar4 = 0;
  do {
    if (lVar6 == 0xd) {
      return uVar4;
    }
    bVar7 = false;
    uVar3 = (0x98L << ((byte)lVar6 & 0x3f)) + (0x7f / uVar5) * 8 + 0x150;
    if (uVar3 <= sVar1) {
      sVar2 = secp256k1_pippenger_bucket_window_inv((int)lVar6);
      uVar3 = (sVar1 - uVar3) / ((0x7f / uVar5) * 8 + 0x140);
      bVar7 = sVar2 <= uVar3;
      if (!bVar7) {
        sVar2 = uVar3;
      }
      if (uVar4 < sVar2) {
        uVar4 = sVar2;
      }
    }
    uVar5 = (ulong)((int)uVar5 + 1);
    lVar6 = lVar6 + 1;
  } while (bVar7);
  return uVar4;
}

Assistant:

static size_t secp256k1_pippenger_max_points(const secp256k1_callback* error_callback, secp256k1_scratch *scratch) {
    size_t max_alloc = secp256k1_scratch_max_allocation(error_callback, scratch, PIPPENGER_SCRATCH_OBJECTS);
    int bucket_window;
    size_t res = 0;

    for (bucket_window = 1; bucket_window <= PIPPENGER_MAX_BUCKET_WINDOW; bucket_window++) {
        size_t n_points;
        size_t max_points = secp256k1_pippenger_bucket_window_inv(bucket_window);
        size_t space_for_points;
        size_t space_overhead;
        size_t entry_size = sizeof(secp256k1_ge) + sizeof(secp256k1_scalar) + sizeof(struct secp256k1_pippenger_point_state) + (WNAF_SIZE(bucket_window+1)+1)*sizeof(int);

        entry_size = 2*entry_size;
        space_overhead = (sizeof(secp256k1_gej) << bucket_window) + entry_size + sizeof(struct secp256k1_pippenger_state);
        if (space_overhead > max_alloc) {
            break;
        }
        space_for_points = max_alloc - space_overhead;

        n_points = space_for_points/entry_size;
        n_points = n_points > max_points ? max_points : n_points;
        if (n_points > res) {
            res = n_points;
        }
        if (n_points < max_points) {
            /* A larger bucket_window may support even more points. But if we
             * would choose that then the caller couldn't safely use any number
             * smaller than what this function returns */
            break;
        }
    }
    return res;
}